

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_conjunction_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,ConjunctionExpression *expr,
          idx_t depth)

{
  ClientContext *context;
  reference expr_00;
  type expr_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  pointer pBVar2;
  idx_t i;
  ulong __n;
  BindResult *pBVar3;
  pointer this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_180;
  _Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false> local_178;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_170;
  undefined1 local_168 [16];
  _Alloc_hider local_158;
  pointer local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  ErrorData error;
  ErrorData local_b0;
  
  local_168._8_8_ = __return_storage_ptr__;
  local_158._M_p = (pointer)this;
  ErrorData::ErrorData(&error);
  for (__n = 0; __n < (ulong)((long)(expr->children).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(expr->children).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    expr_00 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(&expr->children,__n);
    BindChild((ExpressionBinder *)local_158._M_p,expr_00,depth,&error);
  }
  if (error.initialized == false) {
    local_148._M_local_buf[0] = (expr->super_ParsedExpression).super_BaseExpression.type;
    make_uniq<duckdb::BoundConjunctionExpression,duckdb::ExpressionType>
              ((duckdb *)&local_178,(ExpressionType *)&local_148._M_allocated_capacity);
    local_150 = (expr->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (expr->children).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_170._M_head_impl = &(local_178._M_head_impl)->super_Expression, this_00 != local_150;
        this_00 = this_00 + 1) {
      expr_01 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(this_00);
      puVar1 = BoundExpression::GetExpression(expr_01);
      pBVar2 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                             *)&local_178);
      context = *(ClientContext **)(local_158._M_p + 0x40);
      local_180._M_head_impl =
           (puVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (puVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      LogicalType::LogicalType((LogicalType *)&local_148,BOOLEAN);
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_168,context,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_180,(LogicalType *)&local_148,false);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar2->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_168);
      if ((_func_int **)local_168._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_168._0_8_ + 8))();
      }
      local_168._0_8_ = (_func_int **)0x0;
      LogicalType::~LogicalType((LogicalType *)&local_148);
      if (local_180._M_head_impl != (Expression *)0x0) {
        (*((local_180._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_180._M_head_impl = (Expression *)0x0;
    }
    local_178._M_head_impl = (BoundConjunctionExpression *)0x0;
    BindResult::BindResult
              ((BindResult *)local_168._8_8_,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_170);
    if ((BoundConjunctionExpression *)local_170._M_head_impl != (BoundConjunctionExpression *)0x0) {
      (*(((Expression *)&(local_170._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_170._M_head_impl = (Expression *)0x0;
    pBVar3 = (BindResult *)local_168._8_8_;
    if (local_178._M_head_impl != (BoundConjunctionExpression *)0x0) {
      (*((local_178._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
      pBVar3 = (BindResult *)local_168._8_8_;
    }
  }
  else {
    ErrorData::ErrorData(&local_b0,&error);
    pBVar3 = (BindResult *)local_168._8_8_;
    BindResult::BindResult((BindResult *)local_168._8_8_,&local_b0);
    ErrorData::~ErrorData(&local_b0);
  }
  ErrorData::~ErrorData(&error);
  return pBVar3;
}

Assistant:

BindResult ExpressionBinder::BindExpression(ConjunctionExpression &expr, idx_t depth) {
	// first try to bind the children of the case expression
	ErrorData error;
	for (idx_t i = 0; i < expr.children.size(); i++) {
		BindChild(expr.children[i], depth, error);
	}
	if (error.HasError()) {
		return BindResult(std::move(error));
	}
	// the children have been successfully resolved
	// cast the input types to boolean (if necessary)
	// and construct the bound conjunction expression
	auto result = make_uniq<BoundConjunctionExpression>(expr.GetExpressionType());
	for (auto &child_expr : expr.children) {
		auto &child = BoundExpression::GetExpression(*child_expr);
		result->children.push_back(BoundCastExpression::AddCastToType(context, std::move(child), LogicalType::BOOLEAN));
	}
	// now create the bound conjunction expression
	return BindResult(std::move(result));
}